

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O2

void writeKeys(string *str,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *keys,vector<int,_std::allocator<int>_> *mapping,size_t n)

{
  pointer pbVar1;
  size_type sVar2;
  int *piVar3;
  pointer pbVar4;
  long lVar5;
  char cVar6;
  int *piVar7;
  char cVar8;
  string *key;
  unsigned_long __val;
  ulong uVar9;
  size_type sVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  size_t local_c8;
  size_t num_chars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  vector<int,_std::allocator<int>_> *local_98;
  string local_90;
  pointer local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sze;
  
  num_chars = 0;
  sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = n;
  local_98 = mapping;
  for (pbVar4 = (keys->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&start,&num_chars);
    local_e8._M_dataplus._M_p = (pointer)pbVar4->_M_string_length;
    num_chars = (size_t)(local_e8._M_dataplus._M_p + num_chars);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&sze,(unsigned_long *)&local_e8);
  }
  std::__cxx11::to_string(&local_90,num_chars);
  std::operator+(&local_b8,"    static constexpr std::array<char, ",&local_90);
  std::operator+(&local_e8,&local_b8,"> flat_keys {\n");
  std::__cxx11::string::append((string *)str);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  local_70 = (keys->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (keys->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != local_70; pbVar4 = pbVar4 + 1)
  {
    cVar6 = '\b';
    while( true ) {
      bVar11 = cVar6 == '\0';
      cVar6 = cVar6 + -1;
      cVar8 = (char)str;
      if (bVar11) break;
      std::__cxx11::string::push_back(cVar8);
    }
    sVar2 = pbVar4->_M_string_length;
    for (sVar10 = 0; sVar2 != sVar10; sVar10 = sVar10 + 1) {
      std::__cxx11::string::push_back(cVar8);
      std::__cxx11::string::push_back(cVar8);
      std::__cxx11::string::push_back(cVar8);
      std::__cxx11::string::push_back(cVar8);
    }
    std::__cxx11::string::push_back(cVar8);
  }
  std::__cxx11::string::append((char *)str);
  __val = local_c8 + 1;
  std::__cxx11::to_string(&local_90,__val);
  std::operator+(&local_b8,"    static constexpr std::array<size_t, ",&local_90);
  std::operator+(&local_e8,&local_b8,"> key_start {\n        ");
  local_c8 = __val;
  std::__cxx11::string::append((string *)str);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  piVar7 = (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar3 = (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  uVar9 = 0;
  lVar5 = 0;
  while( true ) {
    if (piVar7 == piVar3) break;
    if ((lVar5 != 0) && (lVar5 + (uVar9 / 10) * 10 == 0)) {
      std::__cxx11::string::append((char *)str);
    }
    if ((long)*piVar7 == -1) {
      std::__cxx11::string::append((char *)str);
    }
    else {
      std::__cxx11::to_string
                (&local_b8,
                 start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar7]);
      std::operator+(&local_e8,&local_b8,",");
      std::__cxx11::string::append((string *)str);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    piVar7 = piVar7 + 1;
    uVar9 = uVar9 + 1;
    lVar5 = lVar5 + -1;
  }
  std::__cxx11::string::append((char *)str);
  std::__cxx11::to_string(&local_90,local_c8);
  std::operator+(&local_b8,"    static constexpr std::array<size_t, ",&local_90);
  std::operator+(&local_e8,&local_b8,"> key_size {\n        ");
  std::__cxx11::string::append((string *)str);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  piVar7 = (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar3 = (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  uVar9 = 0;
  lVar5 = 0;
  while( true ) {
    if (piVar7 == piVar3) break;
    if ((lVar5 != 0) && (lVar5 + (uVar9 / 10) * 10 == 0)) {
      std::__cxx11::string::append((char *)str);
    }
    if ((long)*piVar7 == -1) {
      std::__cxx11::string::append((char *)str);
    }
    else {
      std::__cxx11::to_string
                (&local_b8,
                 sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar7]);
      std::operator+(&local_e8,&local_b8,",");
      std::__cxx11::string::append((string *)str);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    piVar7 = piVar7 + 1;
    uVar9 = uVar9 + 1;
    lVar5 = lVar5 + -1;
  }
  std::__cxx11::string::append((char *)str);
  std::__cxx11::string::append((char *)str);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void writeKeys(std::string& str,
               const std::vector<std::string>& keys,
               const std::vector<int>& mapping,
               size_t n){
    size_t num_chars = 0;
    std::vector<size_t> sze;
    std::vector<size_t> start;

    for(const std::string& key : keys){
        start.push_back(num_chars);
        num_chars += key.size();
        sze.push_back(key.size());
    }

    str += "    static constexpr std::array<char, " + std::to_string(num_chars) + "> flat_keys {\n";
    for(const std::string& key : keys){
        for(uint8_t i = 0; i < 8; i++) str.push_back(' ');
        for(const char& ch : key){
            str.push_back('\'');
            str.push_back(ch);
            str.push_back('\'');
            str.push_back(',');
        }
        str.push_back('\n');
    }
    str += "    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> key_start {\n        ";
    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(start[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> key_size {\n        ";
    i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(sze[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static inline bool checkBin(const std::string& key, size_t bin) noexcept{\n"
           "        const auto& size = key_size[bin];\n"
           "        if(size != key.size()) return false;\n"
           "        const auto& start = key_start[bin];\n"
           "        for(size_t i = size-1; i < std::numeric_limits<size_t>::max(); i--)\n"
           "            if(key[i] != flat_keys[start+i]) return false;\n"
           "        return true;\n"
           "    }\n";
}